

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count_suite.cpp
# Opt level: O0

void count_u16string(void)

{
  undefined4 local_180;
  allocator<char16_t> local_179;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_178;
  iterator local_158;
  iterator local_140;
  difference_type local_128 [2];
  undefined4 local_118;
  allocator<char16_t> local_111;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_110;
  iterator local_f0;
  iterator local_d8;
  difference_type local_c0 [2];
  undefined4 local_b0;
  allocator<char16_t> local_a9;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_a8;
  iterator local_88;
  iterator local_60;
  difference_type local_48 [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_60,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_88,(basic_variable<std::allocator<char>_> *)local_38);
  std::allocator<char16_t>::allocator(&local_a9);
  std::__cxx11::u16string::u16string<std::allocator<char16_t>>((u16string *)&local_a8,L"",&local_a9)
  ;
  local_48[0] = std::
                count<trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::__cxx11::u16string>
                          (&local_60,&local_88,&local_a8);
  local_b0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(data.begin(), data.end(), std::u16string(u\"\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_suite.cpp"
             ,0x45,"void count_u16string()",local_48,&local_b0);
  std::__cxx11::u16string::~u16string((u16string *)&local_a8);
  std::allocator<char16_t>::~allocator(&local_a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_88);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_60);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_d8,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_f0,(basic_variable<std::allocator<char>_> *)local_38);
  std::allocator<char16_t>::allocator(&local_111);
  std::__cxx11::u16string::u16string<std::allocator<char16_t>>
            ((u16string *)&local_110,L"zulu",&local_111);
  local_c0[0] = std::
                count<trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::__cxx11::u16string>
                          (&local_d8,&local_f0,&local_110);
  local_118 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(data.begin(), data.end(), std::u16string(u\"zulu\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_suite.cpp"
             ,0x46,"void count_u16string()",local_c0,&local_118);
  std::__cxx11::u16string::~u16string((u16string *)&local_110);
  std::allocator<char16_t>::~allocator(&local_111);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_140,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_158,(basic_variable<std::allocator<char>_> *)local_38);
  std::allocator<char16_t>::allocator(&local_179);
  std::__cxx11::u16string::u16string<std::allocator<char16_t>>
            ((u16string *)&local_178,L"charlie",&local_179);
  local_128[0] = std::
                 count<trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::__cxx11::u16string>
                           (&local_140,&local_158,&local_178);
  local_180 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(data.begin(), data.end(), std::u16string(u\"charlie\"))","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_suite.cpp"
             ,0x47,"void count_u16string()",local_128,&local_180);
  std::__cxx11::u16string::~u16string((u16string *)&local_178);
  std::allocator<char16_t>::~allocator(&local_179);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_140);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void count_u16string()
{
    variable data(u"charlie");
    TRIAL_PROTOCOL_TEST_EQUAL(std::count(data.begin(), data.end(), std::u16string(u"")), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count(data.begin(), data.end(), std::u16string(u"zulu")), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count(data.begin(), data.end(), std::u16string(u"charlie")), 1);
}